

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool ON_ArcToArcTransitionIsNotGsmooth
               (ON_Arc *arc0,ON_Arc *arc1,double cos_angle_tolerance,double curvature_tolerance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  byte bVar5;
  ON_3dPoint *pOVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ON_3dVector V1;
  ON_2dVector D;
  ON_3dVector V0;
  ON_3dPoint local_70;
  ON_3dPoint local_58;
  ON_3dPoint local_40;
  
  bVar4 = ON_Arc::IsValid(arc0);
  if (bVar4) {
    bVar4 = ON_Arc::IsValid(arc1);
    if (bVar4) {
      dVar1 = ON_Circle::Radius(&arc0->super_ON_Circle);
      dVar2 = ON_Circle::Radius(&arc1->super_ON_Circle);
      dVar9 = dVar2;
      if (dVar1 < dVar2) {
        dVar9 = dVar1;
      }
      bVar5 = 0;
      if ((dVar1 <= 0.0) || (dVar2 <= 0.0)) goto LAB_00592ca4;
      dVar8 = (double)(~-(ulong)(dVar2 <= dVar1) & (ulong)dVar2 |
                      -(ulong)(dVar2 <= dVar1) & (ulong)dVar1);
      if (1000000.0 <= dVar8) goto LAB_00592ca4;
      dVar8 = dVar8 * 0.1;
      if ((dVar8 < ABS(dVar1 - dVar2)) && (curvature_tolerance < ABS(1.0 / dVar1 - 1.0 / dVar2))) {
        ON_Arc::EndPoint(&local_40,arc0);
        ON_Arc::StartPoint(&local_70,arc1);
        dVar3 = ON_3dPoint::DistanceTo(&local_40,&local_70);
        bVar5 = 0;
        if ((2.3283064365386963e-10 < dVar3) || (dVar9 * 0.01 < dVar3)) goto LAB_00592ca4;
        dVar9 = ON_3dVector::operator*
                          (&(arc0->super_ON_Circle).plane.zaxis,&(arc1->super_ON_Circle).plane.zaxis
                          );
        if (((0.9986295347545738 <= dVar9) || (cos_angle_tolerance <= dVar9)) ||
           (dVar9 < 1.0000000149011612)) {
          ON_Arc::EndPoint(&local_70,arc0);
          pOVar6 = ON_Circle::Center(&arc0->super_ON_Circle);
          ON_3dPoint::operator-((ON_3dVector *)&local_40,&local_70,pOVar6);
          ON_Arc::StartPoint(&local_58,arc1);
          pOVar6 = ON_Circle::Center(&arc1->super_ON_Circle);
          ON_3dPoint::operator-((ON_3dVector *)&local_70,&local_58,pOVar6);
          ON_3dVector::Unitize((ON_3dVector *)&local_40);
          ON_3dVector::Unitize((ON_3dVector *)&local_70);
          dVar9 = ON_3dVector::operator*((ON_3dVector *)&local_40,(ON_3dVector *)&local_70);
          if (((0.9986295347545738 <= dVar9) || (cos_angle_tolerance <= dVar9)) ||
             (dVar9 < 1.0000000149011612)) {
            dVar9 = ON_Arc::AngleRadians(arc0);
            dVar3 = ON_Arc::AngleRadians(arc1);
            dVar10 = 3.141592653589793;
            if (ABS(dVar9) <= 3.141592653589793) {
              dVar10 = ABS(dVar9);
            }
            dVar9 = 3.141592653589793;
            if (ABS(dVar3) <= 3.141592653589793) {
              dVar9 = ABS(dVar3);
            }
            dVar7 = dVar1 * dVar10;
            dVar3 = dVar2 * dVar9;
            if (dVar7 <= dVar3) {
              if (dVar7 < dVar3) {
                dVar9 = dVar7 / dVar2;
              }
            }
            else {
              dVar10 = dVar3 / dVar1;
            }
            bVar5 = 0;
            if ((2.3283064365386963e-10 < dVar7) && (2.3283064365386963e-10 < dVar3)) {
              dVar3 = cos(dVar10);
              dVar7 = cos(dVar9);
              dVar10 = sin(dVar10);
              dVar9 = sin(dVar9);
              ON_2dVector::ON_2dVector
                        ((ON_2dVector *)&local_58,dVar7 * (dVar2 + -1.0) + dVar3 * (1.0 - dVar1),
                         dVar10 * dVar1 - dVar9 * dVar2);
              dVar1 = ON_2dVector::Length((ON_2dVector *)&local_58);
              bVar5 = -(2.3283064365386963e-10 < dVar1) & -(dVar8 < dVar1);
            }
            goto LAB_00592ca4;
          }
        }
      }
    }
  }
  bVar5 = 0;
LAB_00592ca4:
  return (bool)(bVar5 & 1);
}

Assistant:

static bool ON_ArcToArcTransitionIsNotGsmooth(
  const ON_Arc& arc0,
  const ON_Arc& arc1,
  double cos_angle_tolerance,
  double curvature_tolerance
  )
{
  const double tolerance = ON_ZERO_TOLERANCE;
  if ( !arc0.IsValid() )
    return false;
  if ( !arc1.IsValid() )
    return false;

  const double r0 = arc0.Radius();
  const double r1 = arc1.Radius();
  const double maxr = (r0 >= r1) ? r0 : r1;
  const double minr = (r0 >= r1) ? r1 : r0;
  if ( !(r0 > 0.0 && r1 > 0.0 && maxr < 1.0e6) )
    return false;

  // Please discuss any changes to this 10% max radius
  // test with Dale Lear.
  // This function detects aesthetic changes - it is not
  // intended to be used for any other purpose.
  if ( !(fabs(r0-r1) > 0.1*maxr) )
    return false;

  if ( fabs(1.0/r0 - 1.0/r1) <= curvature_tolerance )
    return false;

  // The end of arc0 and the start of arc1 must be coincident.
  double d = arc0.EndPoint().DistanceTo(arc1.StartPoint());
  if ( !(d <= tolerance && d <= 0.01*minr) )
    return false;

  // arcs must be coplanar
  d = arc0.plane.zaxis*arc1.plane.zaxis;
  if ( !(d >= cos(3.0*ON_PI/180.0)) && !(d >= cos_angle_tolerance) && !(d < 1.0+ON_SQRT_EPSILON) )
  {
    // arcs are not coplanar
    return false;
  }

  // arcs must be tangent and have centers on the same side of the common point.
  ON_3dVector V0 = arc0.EndPoint() - arc0.Center();
  ON_3dVector V1 = arc1.StartPoint() - arc1.Center();
  V0.Unitize();
  V1.Unitize();
  d = V0*V1;
  if ( !(d >= cos(3.0*ON_PI/180.0)) && !(d >= cos_angle_tolerance) && !(d < 1.0+ON_SQRT_EPSILON) )
  {
    // arcs are not tangent or do not have their centers on
    // the same side of the common point.
    return false;
  }

  // If the arcs started at the same location,
  // they were tangent at the start, and they
  // were both the length of the shortest arc,
  // then we should be able to "see" the difference
  // in the end points.
  double a0 = fabs(arc0.AngleRadians());
  double a1 = fabs(arc1.AngleRadians());
  if (a0 > ON_PI)
    a0 = ON_PI;
  if (a1 > ON_PI)
    a1 = ON_PI;
  double l0 = r0*a0;
  double l1 = r1*a1;
  if ( l0 > l1 )
  {
    a0 = l1/r0;
  }
  else if ( l1 > l0 )
  {
    a1 = l0/r1;
  }
  if ( l0 > tolerance && l1 > tolerance )
  {
    ON_2dVector D((1.0-r0)*cos(a0) + (r1-1.0)*cos(a1),r0*sin(a0)-r1*sin(a1));
    d = D.Length();
    if ( d > tolerance && d > 0.1*maxr )
      return true; // "visibly" different
  }

  return false;
}